

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O2

void __thiscall SynthWidget::handleMIDISessionAdded(SynthWidget *this,MidiSession *midiSession)

{
  QListWidgetItem *this_00;
  QObject **value;
  enable_if_t<std::is_copy_constructible_v<QObject_*>,_QVariant> local_40;
  undefined8 local_20;
  
  this_00 = (QListWidgetItem *)operator_new(0x28);
  MidiSession::getName((QString *)&local_40,midiSession);
  QListWidgetItem::QListWidgetItem
            (this_00,(QString *)&local_40,(this->ui->super_Ui_SynthWidget).midiList,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
  local_20 = midiSession;
  QVariant::fromValue<QObject*>(&local_40,(QVariant *)&stack0xffffffffffffffe0,value);
  (**(code **)(*(long *)this_00 + 0x20))(this_00,0x100,&local_40);
  QVariant::~QVariant(&local_40);
  QListWidget::addItem((this->ui->super_Ui_SynthWidget).midiList,this_00);
  updateMidiAddActionEnabled(this->ui);
  return;
}

Assistant:

void SynthWidget::handleMIDISessionAdded(MidiSession *midiSession) {
	QListWidgetItem *item = new QListWidgetItem(midiSession->getName(), ui->midiList);
	item->setData(Qt::UserRole, QVariant::fromValue((QObject *)midiSession));
	ui->midiList->addItem(item);
	updateMidiAddActionEnabled(ui);
}